

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O3

BOOL macro_sub(List *ls,SymbolTable *sym,BOOL flag_failure)

{
  Token *original;
  TokenType TVar1;
  long lVar2;
  long *plVar3;
  bool bVar4;
  HashErr HVar5;
  uint uVar6;
  int iVar7;
  BOOL BVar8;
  List *pLVar9;
  char *pcVar10;
  int iVar11;
  long *plVar12;
  long *plVar13;
  ListStruct *pLVar14;
  List *pLVar15;
  uint uVar16;
  char *fmt;
  uint uVar17;
  SymbolInfo SVar18;
  undefined8 *puVar19;
  SymbolInfo info;
  char buf [1024];
  undefined8 *local_458;
  SymbolInfo local_440;
  char local_438 [1032];
  
  TVar1 = (ls->token).type;
  pLVar9 = ls;
  if (TVar1 == TOK_IDENTIFIER) {
LAB_00108378:
    pcVar10 = (pLVar9->token).u.string;
    pLVar9 = (List *)0x0;
  }
  else if (TVar1 == TOK_LIST) {
    pLVar9 = ls->car;
    if (pLVar9 == (List *)0x0) {
      if (flag_failure == FALSE) {
        return FALSE;
      }
      pcVar10 = "Macro name is missing!\n";
      goto LAB_00108664;
    }
    if ((pLVar9->token).type == TOK_IDENTIFIER) goto LAB_00108378;
    pcVar10 = (char *)0x0;
  }
  else {
    pcVar10 = (char *)0x0;
  }
  HVar5 = lookup_symbol(sym,pcVar10,&local_440,(char **)0x0);
  if (HVar5 == HASH_NOTFOUND) {
    if (flag_failure == FALSE) {
      return FALSE;
    }
    if (pcVar10 == (char *)0x0) {
      if (pLVar9 == (List *)0x0) {
        pcVar10 = "Unknown operator.\n";
LAB_00108664:
        parse_error(ls,pcVar10);
        return FALSE;
      }
      pcVar10 = unparse_token(&pLVar9->token,local_438);
      fmt = "Unknown operator \"%s\"\n";
      ls = pLVar9;
    }
    else {
      fmt = "Unknown operator \"%s\".\n";
    }
  }
  else {
    if ((long *)local_440.n != (long *)0x0) {
      original = &ls->token;
      local_458 = (undefined8 *)0x0;
      SVar18 = local_440;
      do {
        lVar2 = *SVar18.p;
        if (original->type == *(TokenType *)(lVar2 + 0x10)) {
          if (original->type == TOK_IDENTIFIER) {
            uVar6 = (uint)(local_458 == (undefined8 *)0x0);
LAB_00108429:
            if (uVar6 != 0) {
LAB_0010842d:
              local_458 = *SVar18.p;
            }
          }
          else {
            uVar6 = list_length(ls->car);
            iVar7 = list_length(*(List **)(lVar2 + 8));
            plVar13 = *(long **)(lVar2 + 8);
            plVar3 = plVar13;
            if (plVar13 == (long *)0x0) {
              uVar16 = 0;
            }
            else {
              do {
                plVar12 = plVar3;
                plVar3 = (long *)*plVar12;
              } while (plVar3 != (long *)0x0);
              uVar16 = (uint)((int)plVar12[2] == 0x4a);
            }
            if ((((int)uVar6 <= iVar7) || (uVar16 != 0)) &&
               (uVar17 = iVar7 - uVar16, uVar17 <= uVar6)) {
              pLVar14 = ls->car->cdr;
              if (pLVar14 != (ListStruct *)0x0) {
                for (puVar19 = (undefined8 *)*plVar13; puVar19 != (undefined8 *)0x0;
                    puVar19 = (undefined8 *)*puVar19) {
                  if (((*(int *)(puVar19 + 2) != 0x1b) && (*(int *)(puVar19 + 2) != 0x4a)) &&
                     (BVar8 = tokens_equal(&pLVar14->token,(Token *)(puVar19 + 2)), BVar8 == FALSE))
                  goto LAB_00108489;
                  pLVar14 = pLVar14->cdr;
                  if (pLVar14 == (ListStruct *)0x0) break;
                }
              }
              if (local_458 != (undefined8 *)0x0) {
                plVar13 = (long *)**(long **)(lVar2 + 8);
                iVar7 = 0;
                iVar11 = 0;
                if (plVar13 != (long *)0x0) {
                  iVar11 = 0;
                  do {
                    if (((int)plVar13[2] != 0x1b) && ((int)plVar13[2] != 0x4a)) {
                      iVar11 = iVar11 + 1;
                    }
                    plVar13 = (long *)*plVar13;
                  } while (plVar13 != (long *)0x0);
                }
                pLVar9 = (List *)local_458[1];
                pLVar14 = pLVar9->cdr;
                if (pLVar14 != (ListStruct *)0x0) {
                  iVar7 = 0;
                  do {
                    TVar1 = (pLVar14->token).type;
                    if ((TVar1 != TOK_IDENTIFIER) && (TVar1 != TOK_TAIL)) {
                      iVar7 = iVar7 + 1;
                    }
                    pLVar14 = pLVar14->cdr;
                  } while (pLVar14 != (ListStruct *)0x0);
                }
                pLVar14 = pLVar9;
                if (iVar11 == iVar7) {
                  do {
                    pLVar15 = pLVar14;
                    pLVar14 = pLVar15->cdr;
                  } while (pLVar14 != (ListStruct *)0x0);
                  TVar1 = (pLVar15->token).type;
                  iVar7 = list_length(pLVar9);
                  uVar6 = (uint)(TVar1 == TOK_TAIL);
                  if (uVar17 == iVar7 - uVar6) {
                    if (uVar16 != uVar6) goto LAB_00108429;
                    goto LAB_00108489;
                  }
                  bVar4 = iVar7 - uVar6 < uVar17;
                }
                else {
                  bVar4 = iVar7 < iVar11;
                }
                uVar6 = (uint)bVar4;
                goto LAB_00108429;
              }
              goto LAB_0010842d;
            }
          }
        }
LAB_00108489:
        SVar18 = (SymbolInfo)((SymbolInfo *)(SVar18.n + 8))->p;
      } while ((long *)SVar18.n != (long *)0x0);
      if (local_458 != (undefined8 *)0x0) {
        pLVar9 = (List *)*local_458;
        if (original->type == TOK_LIST) {
          pLVar9 = copy_list(pLVar9);
          substitute_args(ls->car->cdr,*(List **)local_458[1],pLVar9);
        }
        else {
          if (pLVar9 == (List *)0x0) {
            original->type = TOK_EMPTY;
            return TRUE;
          }
          if ((pLVar9->cdr == (ListStruct *)0x0) &&
             (TVar1 = (pLVar9->token).type, TVar1 != TOK_LIST)) {
            (ls->token).type = TVar1;
            (ls->token).u = (pLVar9->token).u;
            return TRUE;
          }
          pLVar9 = copy_list(pLVar9);
          propagate_fileinfo(original,pLVar9);
        }
        replace_list(ls,pLVar9);
        return TRUE;
      }
    }
    if (flag_failure == FALSE) {
      return FALSE;
    }
    fmt = "No applicable version of the \"%s\" macro exists for these arguments.\n";
  }
  parse_error(ls,fmt,pcVar10);
  return FALSE;
}

Assistant:

BOOL
macro_sub (List *ls, const SymbolTable *sym, BOOL flag_failure)
{
  const Macro *m;
  List *best = NULL, *new, *op;
  SymbolInfo info;
  const char *name;

#ifdef DEBUG
  printf ("macro_sub: "); print_list (ls, stdout); putchar ('\n');
#endif


  /* Get the name of the macro to be expanded. */
  op = NULL;
  if (ls->token.type == TOK_LIST)
    {
      if (ls->car == NULL)
	{
	  if (flag_failure)
	    parse_error (ls, "Macro name is missing!\n");
	  return FALSE;
	}
      if (ls->car->token.type == TOK_IDENTIFIER)
	name = ls->car->token.u.string;
      else
	{
	  op = ls->car;
	  name = NULL;
	}
    }
  else if (ls->token.type == TOK_IDENTIFIER)
    name = ls->token.u.string;
  else
    {
      op = ls;
      name = NULL;
    }

  /* Look up the macro list in the symbol table. */
  if (lookup_symbol (sym, name, &info, NULL) == HASH_NOTFOUND)
    {
      if (flag_failure)
	{
	  char buf[1024];
	  if (name == NULL)
	    {
	      if (op != NULL)
		parse_error (op, "Unknown operator \"%s\"\n",
			     unparse_token (&op->token, buf));
	      else
		parse_error (ls, "Unknown operator.\n");
	    }
	  else
	    parse_error (ls, "Unknown operator \"%s\".\n", name);
	}
      return FALSE;
    }
  m = (const Macro *) info.p;


  /* Now we have a list of macros and we have to choose the best match by the
   * following heuristics, in order:
   *  (1) Invocation form matching.  "foo" and "(foo)" can only match
   *      (define foo ...) and (define (foo) ...), respectively.
   *  (2) The number of arguments must match.  Note that the "+tail" construct
   *      can allow an arbitrarily high number of arguments.
   *  (3) All literals must match (see 3, below)
   *  (4) Number of literal matches.  For example, it is legal to both
   *      (define (foo a1 a2 0) x) and (define (foo a1 a2 a3) y).  In this
   *      example, an invocation of (foo 2 1 0) would expand to x.
   *  (5) Larger number of arguments.  Whichever macro names the most arguments
   *      (disregarding any "+tail", of course) will be preferred.
   *  (6) Prefer the macro without a "+tail".
   *  (7) Lexical predecence.  In case of a tie, the first macro defined will
   *      be chosen.
   */

  /* Find the best match. */
  for (best = NULL; m != NULL; m = m->next)
    if (better_match (ls, m->expr, best))
      best = m->expr;

  /* Was there no match at all? */
  if (best == NULL)
    {
      if (flag_failure)
	parse_error (ls, "No applicable version of the \"%s\" macro exists "
		     "for these arguments.\n", name);
      return FALSE;
    }

  /* Is this simple substitution (ie, no macro arguments, etc.) */
  if (ls->token.type != TOK_LIST)
    {
      if (best->cdr == NULL)  /* Empty list? */
	ls->token.type = TOK_EMPTY;
      else if (CDDR (best) == NULL && best->cdr->token.type != TOK_LIST)
	{
	  ls->token.type = best->cdr->token.type;
	  ls->token.u    = best->cdr->token.u;
	}
      else
	{
	  new = copy_list (best->cdr);
	  propagate_fileinfo (&ls->token, new);  /* So we don't forget... */
	  replace_list (ls, new);
	}

      return TRUE;
    }

  /* It's a complicate macro with arguments.  Substitute in the arguments. */
  new = copy_list (best->cdr);
  substitute_args (CDAR (ls), CDAR (best), new);
  replace_list (ls, new);

  return TRUE;
}